

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *args,unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                       *selector)

{
  size_type arity;
  pointer pAVar1;
  pointer pTVar2;
  pointer pTVar3;
  type pTVar4;
  anon_class_8_1_70dd1d2d local_58;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  _Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor> local_30;
  iterator descriptor;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
  *selector_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  TransformAction action_local;
  cmList *this_local;
  
  descriptor._M_node = (_Base_ptr)selector;
  arity = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  local_30._M_node = (_Base_ptr)anon_unknown.dwarf_65b3cd::TransformConfigure(action,selector,arity)
  ;
  pAVar1 = std::_Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor>::operator->
                     (&local_30);
  pTVar2 = std::
           unique_ptr<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           ::operator->(&pAVar1->Transform);
  pTVar3 = std::
           unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>::
           get(selector);
  (*pTVar2->_vptr_TransformAction[4])(pTVar2,pTVar3,args);
  pTVar4 = std::
           unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>::
           operator*(selector);
  local_58.descriptor = &local_30;
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<cmList::transform(cmList::TransformAction,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>)::__0,void>
            ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_50,&local_58);
  (*pTVar4->_vptr_TransformSelector[5])(pTVar4,this,&local_50);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_50);
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action,
                          std::vector<std::string> const& args,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, args.size());

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()), args);

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}